

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::compile_fixture::compile_fixture(compile_fixture *this)

{
  logic_error e;
  _func_unsigned_long_void_ptr_varargs *local_228;
  fun_ptr f;
  uint64_t size;
  first_pass_data d;
  asmcode code;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> local_170;
  undefined1 local_160 [336];
  compile_fixture *local_10;
  compile_fixture *this_local;
  
  this->_vptr_compile_fixture = (_func_int **)&PTR__compile_fixture_0032c228;
  local_10 = this;
  skiwi::compiler_options::compiler_options(&this->ops);
  skiwi::repl_data::repl_data(&this->rd);
  macro_data::macro_data(&this->md);
  std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::shared_ptr(&this->env);
  std::
  vector<std::pair<unsigned_long_(*)(void_*,_...),_unsigned_long>,_std::allocator<std::pair<unsigned_long_(*)(void_*,_...),_unsigned_long>_>_>
  ::vector(&this->compiled_functions);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry>_>_>
  ::map(&this->pm);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function>_>_>
  ::map(&this->externals);
  skiwi::add_system_calls((map *)&this->externals);
  this->stream_out = false;
  skiwi::create_context((ulong)local_160,0x100000,0x400,0x400);
  memcpy(&this->ctxt,local_160,0x140);
  std::make_shared<skiwi::environment<skiwi::environment_entry>,decltype(nullptr)>
            ((void **)&local_170);
  std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::operator=(&this->env,&local_170);
  std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::~shared_ptr(&local_170);
  assembler::asmcode::asmcode
            ((asmcode *)&d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_node_count);
  skiwi::compile_primitives_library
            ((map *)&this->pm,&this->rd,(shared_ptr *)&this->env,&this->ctxt,
             (asmcode *)&d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &this->ops);
  digest_asmcode((asmcode *)&d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  assembler::first_pass_data::first_pass_data((first_pass_data *)&size);
  local_228 = (_func_unsigned_long_void_ptr_varargs *)
              assembler::assemble((ulong *)&f,(first_pass_data *)&size,
                                  (asmcode *)
                                  &d.external_to_address._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count);
  (*local_228)(&this->ctxt);
  std::
  vector<std::pair<unsigned_long(*)(void*,...),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,...),unsigned_long>>>
  ::emplace_back<unsigned_long(*&)(void*,___),unsigned_long&>
            ((vector<std::pair<unsigned_long(*)(void*,___),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,___),unsigned_long>>>
              *)&this->compiled_functions,&local_228,(unsigned_long *)&f);
  skiwi::assign_primitive_addresses((map *)&this->pm,(first_pass_data *)&size,(ulong)local_228);
  assembler::first_pass_data::~first_pass_data((first_pass_data *)&size);
  assembler::asmcode::~asmcode
            ((asmcode *)&d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

compile_fixture()
      {
      add_system_calls(externals);
      stream_out = false;
      ctxt = create_context(1024 * 1024, 1024, 1024, 1024);
      env = std::make_shared<environment<environment_entry>>(nullptr);
      //rd = repl_data();

      asmcode code;
      try
        {
        compile_primitives_library(pm, rd, env, ctxt, code, ops);
        digest_asmcode(code);
        first_pass_data d;
        uint64_t size;
        fun_ptr f = (fun_ptr)assemble(size, d, code);
        f(&ctxt);
        compiled_functions.emplace_back(f, size);
        assign_primitive_addresses(pm, d, (uint64_t)f);
        }
      catch (std::logic_error e)
        {
        std::cout << e.what() << " while compiling primitives library\n\n";
        }
      }